

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void btreeEndTransaction(Btree *p)

{
  int *piVar1;
  BtShared *pBVar2;
  ushort uVar3;
  BtLock *pBVar4;
  BtLock **ppBVar5;
  
  pBVar2 = p->pBt;
  pBVar2->bDoTruncate = '\0';
  if (p->inTrans == '\0') goto LAB_0015fd18;
  if (1 < p->db->activeVdbeCnt) {
    if (pBVar2->pWriter == p) {
      pBVar2->pWriter = (Btree *)0x0;
      *(byte *)&pBVar2->btsFlags = (byte)pBVar2->btsFlags & 0x9f;
      for (pBVar4 = pBVar2->pLock; pBVar4 != (BtLock *)0x0; pBVar4 = pBVar4->pNext) {
        pBVar4->eLock = '\x01';
      }
    }
    p->inTrans = '\x01';
    return;
  }
  if (p->inTrans == '\0') goto LAB_0015fd18;
  pBVar4 = pBVar2->pLock;
  if (pBVar4 != (BtLock *)0x0) {
    ppBVar5 = &pBVar2->pLock;
    do {
      if (pBVar4->pBtree == p) {
        *ppBVar5 = pBVar4->pNext;
        if (pBVar4->iTable != 1) {
          sqlite3_free(pBVar4);
        }
      }
      else {
        ppBVar5 = &pBVar4->pNext;
      }
      pBVar4 = *ppBVar5;
    } while (pBVar4 != (BtLock *)0x0);
  }
  if (pBVar2->pWriter == p) {
    pBVar2->pWriter = (Btree *)0x0;
    uVar3 = 0xff9f;
LAB_0015fd08:
    pBVar2->btsFlags = pBVar2->btsFlags & uVar3;
  }
  else {
    uVar3 = 0xffbf;
    if (pBVar2->nTransaction == 2) goto LAB_0015fd08;
  }
  piVar1 = &pBVar2->nTransaction;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    pBVar2->inTransaction = '\0';
  }
LAB_0015fd18:
  p->inTrans = '\0';
  if ((pBVar2->inTransaction == '\0') && (pBVar2->pPage1 != (MemPage *)0x0)) {
    sqlite3PagerUnref(pBVar2->pPage1->pDbPage);
    pBVar2->pPage1 = (MemPage *)0x0;
  }
  return;
}

Assistant:

static void btreeEndTransaction(Btree *p){
  BtShared *pBt = p->pBt;
  assert( sqlite3BtreeHoldsMutex(p) );

#ifndef SQLITE_OMIT_AUTOVACUUM
  pBt->bDoTruncate = 0;
#endif
  if( p->inTrans>TRANS_NONE && p->db->activeVdbeCnt>1 ){
    /* If there are other active statements that belong to this database
    ** handle, downgrade to a read-only transaction. The other statements
    ** may still be reading from the database.  */
    downgradeAllSharedCacheTableLocks(p);
    p->inTrans = TRANS_READ;
  }else{
    /* If the handle had any kind of transaction open, decrement the 
    ** transaction count of the shared btree. If the transaction count 
    ** reaches 0, set the shared state to TRANS_NONE. The unlockBtreeIfUnused()
    ** call below will unlock the pager.  */
    if( p->inTrans!=TRANS_NONE ){
      clearAllSharedCacheTableLocks(p);
      pBt->nTransaction--;
      if( 0==pBt->nTransaction ){
        pBt->inTransaction = TRANS_NONE;
      }
    }

    /* Set the current transaction state to TRANS_NONE and unlock the 
    ** pager if this call closed the only read or write transaction.  */
    p->inTrans = TRANS_NONE;
    unlockBtreeIfUnused(pBt);
  }

  btreeIntegrity(p);
}